

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.cc
# Opt level: O1

void __thiscall xemmai::t_fiber::t_internal::f_epoch_scan(t_internal *this)

{
  mutex *__mutex;
  t_object ***ppptVar1;
  t_object **pptVar2;
  t_engine *ptVar3;
  int iVar4;
  long lVar5;
  t_object *ptVar6;
  t_object **a_q1;
  t_object **pptVar7;
  t_object **pptVar8;
  long in_FS_OFFSET;
  t_object **top1;
  t_object **p1;
  t_object **top0;
  t_object **p0;
  t_object **local_60;
  t_object **local_58;
  t_object **local_50;
  pthread_mutex_t *local_48;
  t_engine *local_40;
  _Head_base<0UL,_xemmai::t_object_**,_false> local_38;
  
  pptVar2 = this->v_estack_last_used;
  pptVar7 = (t_object **)
            (((long)this->v_estack_used -
              (long)(this->v_estack)._M_t.
                    super___uniq_ptr_impl<xemmai::t_value<xemmai::t_pointer>,_std::default_delete<xemmai::t_value<xemmai::t_pointer>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_xemmai::t_value<xemmai::t_pointer>_*,_std::default_delete<xemmai::t_value<xemmai::t_pointer>[]>_>
                    .super__Head_base<0UL,_xemmai::t_value<xemmai::t_pointer>_*,_false>._M_head_impl
             >> 1) + (long)this->v_estack_last_head);
  this->v_estack_last_used = pptVar7;
  lVar5 = (long)this->v_stack_bottom - (long)this->v_stack_top;
  local_50 = (t_object **)((long)this->v_stack_copy - lVar5);
  local_60 = (t_object **)((long)this->v_stack_last_bottom - lVar5);
  pptVar8 = this->v_stack_last_top;
  this->v_stack_last_top = local_60;
  local_40 = *(t_engine **)(in_FS_OFFSET + -0x60);
  __mutex = &(local_40->v_object__heap).v_mutex;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  ptVar3 = local_40;
  if (iVar4 == 0) {
    local_38._M_head_impl =
         (this->v_estack_buffer)._M_t.
         super___uniq_ptr_impl<xemmai::t_object_*,_std::default_delete<xemmai::t_object_*[]>_>._M_t.
         super__Tuple_impl<0UL,_xemmai::t_object_**,_std::default_delete<xemmai::t_object_*[]>_>.
         super__Head_base<0UL,_xemmai::t_object_**,_false>._M_head_impl;
    ppptVar1 = &this->v_estack_decrements;
    this->v_estack_decrements = local_38._M_head_impl;
    local_58 = this->v_estack_last_head;
    a_q1 = pptVar7;
    if (pptVar2 < pptVar7) {
      a_q1 = pptVar2;
    }
    local_48 = (pthread_mutex_t *)__mutex;
    t_engine::f_epoch_increment(local_40,&local_38._M_head_impl,&local_58,a_q1,ppptVar1);
    if (pptVar2 < pptVar7) {
      do {
        pptVar2 = local_38._M_head_impl + 1;
        ptVar6 = *local_38._M_head_impl;
        local_38._M_head_impl = pptVar2;
        if ((((ulong)ptVar6 & 0x7f) == 0) &&
           (ptVar6 = t_heap<xemmai::t_object>::f_find(&ptVar3->v_object__heap,ptVar6),
           ptVar6 != (t_object *)0x0)) {
          if (ptVar6->v_type == (t_type *)0x0) {
            ptVar6 = (t_object *)0x0;
          }
        }
        else {
          ptVar6 = (t_object *)0x0;
        }
        if (ptVar6 != (t_object *)0x0) {
          ptVar6->v_count = ptVar6->v_count + 1;
          ptVar6->v_color = c_color__BLACK;
        }
        pptVar2 = local_58 + 1;
        *local_58 = ptVar6;
        local_58 = pptVar2;
      } while (pptVar2 < pptVar7);
    }
    else {
      for (; local_58 < pptVar2; local_58 = local_58 + 1) {
        ptVar6 = *local_58;
        if (ptVar6 != (t_object *)0x0) {
          pptVar7 = *ppptVar1;
          *ppptVar1 = pptVar7 + 1;
          *pptVar7 = ptVar6;
        }
      }
    }
    ppptVar1 = &this->v_stack_decrements;
    this->v_stack_decrements = this->v_stack_last_bottom;
    if (local_60 < pptVar8) {
      do {
        pptVar2 = local_50 + 1;
        ptVar6 = *local_50;
        local_50 = pptVar2;
        if ((((ulong)ptVar6 & 0x7f) == 0) &&
           (ptVar6 = t_heap<xemmai::t_object>::f_find(&ptVar3->v_object__heap,ptVar6),
           ptVar6 != (t_object *)0x0)) {
          if (ptVar6->v_type == (t_type *)0x0) {
            ptVar6 = (t_object *)0x0;
          }
        }
        else {
          ptVar6 = (t_object *)0x0;
        }
        if (ptVar6 != (t_object *)0x0) {
          ptVar6->v_count = ptVar6->v_count + 1;
          ptVar6->v_color = c_color__BLACK;
        }
        pptVar2 = local_60 + 1;
        *local_60 = ptVar6;
        local_60 = pptVar2;
      } while (pptVar2 < pptVar8);
    }
    else {
      for (; pptVar8 < local_60; pptVar8 = pptVar8 + 1) {
        ptVar6 = *pptVar8;
        if (ptVar6 != (t_object *)0x0) {
          pptVar2 = *ppptVar1;
          *ppptVar1 = pptVar2 + 1;
          *pptVar2 = ptVar6;
        }
      }
    }
    t_engine::f_epoch_increment(local_40,&local_50,&local_60,this->v_stack_last_bottom,ppptVar1);
    pthread_mutex_unlock(local_48);
    return;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

void t_fiber::t_internal::f_epoch_scan()
{
	auto used1 = v_estack_last_head + (v_estack_used - v_estack.get());
	auto used2 = v_estack_last_used;
	v_estack_last_used = used1;
	auto n = v_stack_bottom - v_stack_top;
	auto top0 = v_stack_copy - n;
	auto top1 = v_stack_last_bottom - n;
	auto top2 = v_stack_last_top;
	v_stack_last_top = top1;
	auto engine = f_engine();
	std::lock_guard lock(engine->v_object__heap.f_mutex());
	auto p0 = v_estack_decrements = v_estack_buffer.get();
	auto p1 = v_estack_last_head;
	engine->f_epoch_increment(p0, p1, std::min(used1, used2), v_estack_decrements);
	auto increment = [&](auto& p0, auto& p1, auto p2)
	{
		do {
			auto p = engine->f_object__find(*p0++);
			if (p) p->f_increment();
			*p1++ = p;
		} while (p1 < p2);
	};
	if (used1 > used2)
		increment(p0, p1, used1);
	else
		for (; p1 < used2; ++p1) if (*p1) *v_estack_decrements++ = *p1;
	v_stack_decrements = v_stack_last_bottom;
	if (top1 < top2)
		increment(top0, top1, top2);
	else
		for (; top2 < top1; ++top2) if (*top2) *v_stack_decrements++ = *top2;
	engine->f_epoch_increment(top0, top1, v_stack_last_bottom, v_stack_decrements);
}